

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucci.cpp
# Opt level: O3

CommEnum BootLine(void)

{
  int iVar1;
  char *__s1;
  timespec local_18;
  
  __s1 = ReadInput();
  while (__s1 == (char *)0x0) {
    local_18.tv_sec = 0;
    local_18.tv_nsec = 1000000;
    nanosleep(&local_18,(timespec *)0x0);
    __s1 = ReadInput();
  }
  iVar1 = strcmp(__s1,"ucci");
  return (uint)(iVar1 == 0) * 3;
}

Assistant:

CommEnum BootLine(void) {
    const char *LineStr;
    LineStr = ReadInput();
    while (LineStr == NULL) {
        Idle();
        LineStr = ReadInput();
    }
    if (strcmp(LineStr, "ucci") == 0) {
        return e_CommUcci;
    } else {
        return e_CommNone;
    }
}